

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

void __thiscall ConvexH::ConvexH(ConvexH *this,int vertices_size,int edges_size,int facets_size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtVector3 *ptr;
  HalfEdge *ptr_00;
  cbtPlane *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  cbtVector3 *pcVar8;
  long lVar9;
  HalfEdge *pHVar10;
  cbtPlane *pcVar11;
  cbtScalar *pcVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  uVar6 = 0;
  (this->vertices).m_ownsMemory = true;
  (this->vertices).m_data = (cbtVector3 *)0x0;
  (this->vertices).m_size = 0;
  (this->vertices).m_capacity = 0;
  (this->edges).m_ownsMemory = true;
  (this->edges).m_data = (HalfEdge *)0x0;
  (this->edges).m_size = 0;
  (this->edges).m_capacity = 0;
  (this->facets).m_ownsMemory = true;
  (this->facets).m_data = (cbtPlane *)0x0;
  (this->facets).m_size = 0;
  (this->facets).m_capacity = 0;
  if (0 < vertices_size) {
    pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)vertices_size << 4,0x10);
    lVar9 = (long)(this->vertices).m_size;
    if (0 < lVar9) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->vertices).m_data)->m_floats + lVar13);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar13 = lVar13 + 0x10;
      } while (lVar9 * 0x10 != lVar13);
    }
    ptr = (this->vertices).m_data;
    if ((ptr != (cbtVector3 *)0x0) && ((this->vertices).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->vertices).m_ownsMemory = true;
    (this->vertices).m_data = pcVar8;
    (this->vertices).m_capacity = vertices_size;
    uVar6 = (this->edges).m_size;
  }
  (this->vertices).m_size = vertices_size;
  if (((int)uVar6 < edges_size) && ((this->edges).m_capacity < edges_size)) {
    if (edges_size == 0) {
      pHVar10 = (HalfEdge *)0x0;
    }
    else {
      pHVar10 = (HalfEdge *)cbtAlignedAllocInternal((long)edges_size << 2,0x10);
      uVar6 = (this->edges).m_size;
    }
    if (0 < (int)uVar6) {
      uVar14 = 0;
      do {
        pHVar10[uVar14] = (this->edges).m_data[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar6 != uVar14);
    }
    ptr_00 = (this->edges).m_data;
    if ((ptr_00 != (HalfEdge *)0x0) && ((this->edges).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr_00);
    }
    (this->edges).m_ownsMemory = true;
    (this->edges).m_data = pHVar10;
    (this->edges).m_capacity = edges_size;
  }
  (this->edges).m_size = edges_size;
  uVar6 = (this->facets).m_size;
  if ((int)uVar6 < facets_size) {
    if ((this->facets).m_capacity < facets_size) {
      if (facets_size == 0) {
        pcVar11 = (cbtPlane *)0x0;
        uVar7 = uVar6;
      }
      else {
        pcVar11 = (cbtPlane *)cbtAlignedAllocInternal((long)facets_size * 0x14,0x10);
        uVar7 = (this->facets).m_size;
      }
      if (0 < (int)uVar7) {
        lVar9 = 0;
        do {
          pcVar3 = (this->facets).m_data;
          *(undefined4 *)((long)(&pcVar11->normal + 1) + lVar9) =
               *(undefined4 *)((long)(&pcVar3->normal + 1) + lVar9);
          puVar1 = (undefined8 *)((long)(pcVar3->normal).m_floats + lVar9);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pcVar11->normal).m_floats + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar9 = lVar9 + 0x14;
        } while ((ulong)uVar7 * 0x14 != lVar9);
      }
      pcVar3 = (this->facets).m_data;
      if ((pcVar3 != (cbtPlane *)0x0) && ((this->facets).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar3);
      }
      (this->facets).m_ownsMemory = true;
      (this->facets).m_data = pcVar11;
      (this->facets).m_capacity = facets_size;
    }
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x14));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpaddq_avx512f(auVar19,_DAT_009f0440);
    auVar19 = vpaddq_avx512f(auVar19,_DAT_009f0480);
    uVar14 = 0;
    auVar21 = vpbroadcastq_avx512f();
    pcVar12 = &((this->facets).m_data)->dist;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vpmullq_avx512dq(auVar19,auVar17);
      uVar14 = uVar14 + 0x10;
      auVar19 = vpaddq_avx512f(auVar19,auVar18);
      auVar24 = vporq_avx512f(auVar22,auVar15);
      auVar22 = vporq_avx512f(auVar22,auVar16);
      uVar4 = vpcmpuq_avx512f(auVar22,auVar21,2);
      auVar22 = vpmullq_avx512dq(auVar20,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar24,auVar21,2);
      auVar20 = vpaddq_avx512f(auVar20,auVar18);
      vscatterqps_avx512f(ZEXT864(pcVar12) + auVar23,uVar5,ZEXT1632(ZEXT816(0) << 0x40));
      vscatterqps_avx512f(ZEXT864(pcVar12) + auVar22,uVar4,ZEXT1632(ZEXT816(0) << 0x40));
    } while ((((long)facets_size - (long)(int)uVar6) + 0xfU & 0xfffffffffffffff0) != uVar14);
  }
  (this->facets).m_size = facets_size;
  return;
}

Assistant:

ConvexH::ConvexH(int vertices_size, int edges_size, int facets_size)
{
	vertices.resize(vertices_size);
	edges.resize(edges_size);
	facets.resize(facets_size);
}